

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  
  lVar1 = std::__cxx11::string::find((char)key,0x3a);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)key,0x4455cd);
    pcVar3 = "";
    if (lVar1 == 0) {
      pcVar3 = "\"";
    }
  }
  else {
    pcVar3 = "\"";
  }
  poVar2 = std::operator<<(fout,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)key);
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || key.find("//") == 0) ? "\"" : "";
  fout << q << key << q;
}